

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config.cpp
# Opt level: O0

void check_locale(char **names)

{
  ostream *poVar1;
  char *pcVar2;
  long *in_RDI;
  exception *anon_var_0;
  locale l;
  char *name;
  locale local_38 [12];
  int local_2c;
  int local_28;
  int local_24;
  char *local_20;
  int local_14;
  int local_10;
  int local_c;
  long *local_8;
  
  local_8 = in_RDI;
  poVar1 = std::operator<<((ostream *)&std::cout,"  ");
  local_c = (int)std::setw(0x20);
  poVar1 = std::operator<<(poVar1,(_Setw)local_c);
  poVar1 = std::operator<<(poVar1,"locale");
  local_10 = (int)std::setw(4);
  poVar1 = std::operator<<(poVar1,(_Setw)local_10);
  poVar1 = std::operator<<(poVar1,"C");
  local_14 = (int)std::setw(4);
  poVar1 = std::operator<<(poVar1,(_Setw)local_14);
  poVar1 = std::operator<<(poVar1,"C++");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  for (; *local_8 != 0; local_8 = local_8 + 1) {
    local_20 = (char *)*local_8;
    poVar1 = std::operator<<((ostream *)&std::cout,"  ");
    local_24 = (int)std::setw(0x20);
    poVar1 = std::operator<<(poVar1,(_Setw)local_24);
    poVar1 = std::operator<<(poVar1,local_20);
    local_28 = (int)std::setw(4);
    std::operator<<(poVar1,(_Setw)local_28);
    pcVar2 = setlocale(6,local_20);
    if (pcVar2 == (char *)0x0) {
      std::operator<<((ostream *)&std::cout,"No");
    }
    else {
      std::operator<<((ostream *)&std::cout,"Yes");
    }
    local_2c = (int)std::setw(4);
    std::operator<<((ostream *)&std::cout,(_Setw)local_2c);
    std::locale::locale(local_38,local_20);
    std::operator<<((ostream *)&std::cout,"Yes");
    std::locale::~locale(local_38);
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void check_locale(char const **names)
{
    std::cout << "  " << std::setw(32) << "locale" << std::setw(4) << "C" << std::setw(4) << "C++" << std::endl;
    while(*names) {
        char const *name = *names;
        std::cout << "  " << std::setw(32) << name << std::setw(4);
        if(setlocale(LC_ALL,name)!=0)
            std::cout << "Yes";
        else
            std::cout << "No";
        std::cout << std::setw(4);
        try {
            std::locale l(name);
            std::cout << "Yes";
        }
        catch(std::exception const &) {
            std::cout << "No";
        }
        std::cout << std::endl;
        names++;
    }
}